

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

int __thiscall
kj::HttpServer::Connection::accept(Connection *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
  node;
  PromiseFulfiller<void> *pPVar2;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  undefined1 node_00 [8];
  char *pcVar3;
  size_t sVar4;
  PromiseArenaMember *node_01;
  Disposer *pDVar5;
  PromiseFulfiller<void> *pPVar6;
  HttpHeaders *in_R8;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  DebugExpression<bool> _kjCondition;
  Fault f;
  undefined1 local_98 [8];
  Disposer local_90;
  OwnPromiseNode OStack_88;
  SourceLocation local_80;
  String local_68;
  PromiseArenaMember *local_48;
  size_t sStack_40;
  anon_class_8_1_a7efefcd_for_func local_38;
  
  if ((this->currentMethod).ptr.isSet == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f9a,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)&local_80);
  }
  uVar1 = (this->currentMethod).ptr.field_1.value.tag;
  (this->currentMethod).ptr.isSet = false;
  if (uVar1 - 1 < 2) {
    (this->currentMethod).ptr.field_1.value.tag = 0;
    local_90._vptr_Disposer._0_1_ = uVar1 == 2;
    if (uVar1 == 2) {
      local_90._vptr_Disposer._0_1_ = __fd - 200U < 100;
      if (!local_90._vptr_Disposer._0_1_) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[38]>
                  ((Fault *)&local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x1f9d,FAILED,"statusCode >= 200 && statusCode < 300",
                   "_kjCondition,\"the statusCode must be 2xx for accept\"",(bool *)&local_90,
                   (char (*) [38])"the statusCode must be 2xx for accept");
        kj::_::Debug::Fault::fatal((Fault *)&local_80);
      }
      if ((this->tunnelRejected).ptr.isSet == true) {
        (this->tunnelRejected).ptr.isSet = false;
        node = (this->tunnelRejected).ptr.field_1;
        if (node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
                     )0x0) {
          (this->tunnelRejected).ptr.field_1 =
               (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
                )0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
        }
      }
      if ((this->tunnelWriteGuard).ptr.ptr != (PromiseFulfiller<void> *)0x0) {
        local_48 = (PromiseArenaMember *)0x0;
        sStack_40 = 0;
        kj::_::Stringifier::operator*
                  ((CappedArray<char,_14UL> *)&local_80,(Stringifier *)&kj::_::STR,__fd);
        OStack_88.ptr = (PromiseNode *)((long)__addr_len - 1);
        word3.size_ = (size_t)OStack_88.ptr;
        word3.ptr = (char *)__addr;
        connectionHeaders.size_ = sStack_40;
        connectionHeaders.ptr = (StringPtr *)local_48;
        word1.size_ = 8;
        word1.ptr = "HTTP/1.1";
        word2.size_ = (size_t)local_80.fileName;
        word2.ptr = (char *)&local_80.function;
        local_90._vptr_Disposer = (_func_int **)__addr;
        HttpHeaders::serialize(&local_68,in_R8,word1,word2,word3,connectionHeaders);
        anon_unknown_36::HttpOutputStream::writeHeaders(&this->httpOutput,&local_68);
        sVar4 = local_68.content.size_;
        pcVar3 = local_68.content.ptr;
        if (local_68.content.ptr != (char *)0x0) {
          local_68.content.ptr = (char *)0x0;
          local_68.content.size_ = 0;
          (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                    (local_68.content.disposer,pcVar3,1,sVar4,sVar4,0);
        }
        anon_unknown_36::HttpOutputStream::flush((HttpOutputStream *)local_98);
        local_38.fulfiller = &(this->tunnelWriteGuard).ptr;
        local_80.fileName =
             (char *)kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:8098:44)>
                     ::anon_class_8_1_a7efefcd_for_func::operator();
        kj::_::PromiseDisposer::
        appendPromise<kj::_::SimpleTransformPromiseNode<void,kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_>,kj::_::PromiseDisposer,kj::HttpServer::Connection::accept(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&)::_lambda()_1_,void*&>
                  ((PromiseDisposer *)&local_48,(OwnPromiseNode *)local_98,&local_38,
                   &local_80.fileName);
        local_80.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
        ;
        local_80.function = "accept";
        local_80.lineNumber = 0x1fa2;
        local_80.columnNumber = 0x14;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_90,(OwnPromiseNode *)&local_48,&local_80);
        node_01 = local_48;
        if (local_48 != (PromiseArenaMember *)0x0) {
          local_48 = (PromiseArenaMember *)0x0;
          kj::_::PromiseDisposer::dispose(node_01);
        }
        node_00 = local_98;
        if (local_98 != (undefined1  [8])0x0) {
          local_98 = (undefined1  [8])0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00);
        }
        pPVar2 = (this->tunnelWriteGuard).ptr.ptr;
        pDVar5 = (Disposer *)operator_new(0x20);
        pDVar5[1]._vptr_Disposer = local_90._vptr_Disposer;
        pDVar5[2]._vptr_Disposer = (_func_int **)(this->tunnelWriteGuard).ptr.disposer;
        pDVar5[3]._vptr_Disposer = (_func_int **)pPVar2;
        pDVar5->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_0061ddc8;
        pPVar6 = (PromiseFulfiller<void> *)0x1;
        if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
          pPVar6 = pPVar2;
        }
        (this->tunnelWriteGuard).ptr.disposer = pDVar5;
        (this->tunnelWriteGuard).ptr.ptr = pPVar6;
        return (int)pDVar5;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                ((Fault *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x1fa0,FAILED,"tunnelWriteGuard != nullptr",
                 "\"the tunnel stream was not initialized\"",
                 (char (*) [38])"the tunnel stream was not initialized");
      kj::_::Debug::Fault::fatal((Fault *)&local_80);
    }
  }
  else {
    local_90._vptr_Disposer = (_func_int **)((ulong)local_90._vptr_Disposer._1_7_ << 8);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
            ((Fault *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f9c,FAILED,"method.is<HttpConnectMethod>()",
             "_kjCondition,\"only use accept() with CONNECT requests\"",
             (DebugExpression<bool> *)&local_90,
             (char (*) [40])"only use accept() with CONNECT requests");
  kj::_::Debug::Fault::fatal((Fault *)&local_80);
}

Assistant:

void accept(uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;
    KJ_ASSERT(method.is<HttpConnectMethod>(), "only use accept() with CONNECT requests");
    KJ_REQUIRE(statusCode >= 200 && statusCode < 300, "the statusCode must be 2xx for accept");
    tunnelRejected = kj::none;

    auto& fulfiller = KJ_ASSERT_NONNULL(tunnelWriteGuard, "the tunnel stream was not initialized");
    httpOutput.writeHeaders(headers.serializeResponse(statusCode, statusText));
    auto promise = httpOutput.flush().then([&fulfiller]() {
      fulfiller->fulfill();
    }).eagerlyEvaluate(nullptr);
    fulfiller = fulfiller.attach(kj::mv(promise));
  }